

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O3

void GEN_CS::gen_cs_example_dr<true>(cb_to_cs_adf *c,multi_ex *examples,label *cs_labels)

{
  float fVar1;
  uint32_t uVar2;
  example *ec;
  bool bVar3;
  bool bVar4;
  pointer ppeVar5;
  int known_index;
  ulong uVar6;
  uint uVar7;
  wclass local_68;
  cb_class *local_50;
  v_array<COST_SENSITIVE::wclass> *local_48;
  ulong local_40;
  v_array<COST_SENSITIVE::wclass> *local_38;
  
  local_38 = &(c->pred_scores).costs;
  v_array<COST_SENSITIVE::wclass>::clear(local_38);
  bVar3 = CB::ec_is_example_header
                    (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  uVar7 = (uint)bVar3;
  local_48 = &cs_labels->costs;
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar5) {
    local_50 = &c->known_cost;
    local_40 = (ulong)-uVar7;
    uVar6 = 0;
    do {
      ec = ppeVar5[uVar6];
      if ((((ec->tag)._end != (ec->tag)._begin) ||
          ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin))
         || (bVar4 = CB::ec_is_example_header(ec), bVar4)) {
        local_68.x = 0.0;
        local_68.class_index = 0;
        local_68.partial_prediction = 0.0;
        local_68.wap_value = 0.0;
        uVar2 = (c->known_cost).action;
        if (uVar6 == uVar2 + uVar7) {
          (c->known_cost).action = 0;
          local_68.x = CB_ALGS::get_cost_pred<true>
                                 (c->scorer,local_50,
                                  (examples->
                                  super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                                  .super__Vector_impl_data._M_start[uVar6],0,2);
          (c->known_cost).action = uVar2;
        }
        else {
          local_68.x = CB_ALGS::get_cost_pred<true>
                                 (c->scorer,(cb_class *)0x0,
                                  (examples->
                                  super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                                  .super__Vector_impl_data._M_start[uVar6],0,2);
        }
        local_68.class_index = (int)local_40 + (int)uVar6;
        v_array<COST_SENSITIVE::wclass>::push_back(local_38,&local_68);
        fVar1 = (c->known_cost).probability;
        if (((fVar1 != -1.0) || (NAN(fVar1))) && (uVar6 == (c->known_cost).action + (uint)bVar3)) {
          local_68.x = (local_50->cost - local_68.x) / fVar1 + local_68.x;
        }
        v_array<COST_SENSITIVE::wclass>::push_back(local_48,&local_68);
      }
      uVar6 = uVar6 + 1;
      ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3));
  }
  if (uVar7 != 0) {
    ((v_array<COST_SENSITIVE::wclass> *)&local_48->_begin)->_begin->class_index = 0;
    ((v_array<COST_SENSITIVE::wclass> *)&local_48->_begin)->_begin->x = -3.4028235e+38;
  }
  return;
}

Assistant:

void gen_cs_example_dr(cb_to_cs_adf& c, multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{  // size_t mysize = examples.size();
  c.pred_scores.costs.clear();
  bool shared = CB::ec_is_example_header(*examples[0]);
  int startK = 0;
  if (shared)
    startK = 1;

  cs_labels.costs.clear();
  for (size_t i = 0; i < examples.size(); i++)
  {
    if (CB_ALGS::example_is_newline_not_header(*examples[i]))
      continue;

    COST_SENSITIVE::wclass wc = {0., 0, 0., 0.};

    if (c.known_cost.action + startK == i)
    {
      int known_index = c.known_cost.action;
      c.known_cost.action = 0;
      // get cost prediction for this label
      // num_actions should be 1 effectively.
      // my get_cost_pred function will use 1 for 'index-1+base'
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, &(c.known_cost), *(examples[i]), 0, 2);
      c.known_cost.action = known_index;
    }
    else
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, nullptr, *(examples[i]), 0, 2);

    if (shared)
      wc.class_index = (uint32_t)i - 1;
    else
      wc.class_index = (uint32_t)i;
    c.pred_scores.costs.push_back(wc);  // done

    // add correction if we observed cost for this action and regressor is wrong
    if (c.known_cost.probability != -1 && c.known_cost.action + startK == i)
      wc.x += (c.known_cost.cost - wc.x) / c.known_cost.probability;
    cs_labels.costs.push_back(wc);
  }

  if (shared)  // take care of shared examples
  {
    cs_labels.costs[0].class_index = 0;
    cs_labels.costs[0].x = -FLT_MAX;
  }
}